

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pointer __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::ValueImpl<true>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::io::Printer::ValueImpl<true>_>_>_>
::iterator::operator->(iterator *this)

{
  ctrl_t *pcVar1;
  reference ppVar2;
  variant_alternative_t<1UL,_variant<basic_string<char>,_function<bool_()>_>_> *__rhs;
  pointer in_RSI;
  basic_string_view<char,_std::char_traits<char>_> bStack_28;
  
  pcVar1 = this->ctrl_;
  if (pcVar1 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::ValueImpl<true>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::ValueImpl<true>>>>
    ::iterator::operator->((iterator *)this);
  }
  else if (pcVar1 != kEmptyGroup + 0x10) {
    if (kSentinel < *pcVar1) {
      ppVar2 = operator*(this);
      return ppVar2;
    }
    goto LAB_002f7152;
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::ValueImpl<true>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::ValueImpl<true>>>>
  ::iterator::operator->((iterator *)this);
LAB_002f7152:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::io::Printer::ValueImpl<true>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::io::Printer::ValueImpl<true>>>>
  ::iterator::operator->((iterator *)this);
  if ((pointer)this != in_RSI) {
    if (*(char *)&(in_RSI->second).value.
                  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  .
                  super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                  .
                  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                  .super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                  .super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                  .
                  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
        == '\0') {
      bStack_28._M_str = (in_RSI->first)._M_dataplus._M_p;
      bStack_28._M_len = (in_RSI->first)._M_string_length;
      std::variant<std::basic_string_view<char,std::char_traits<char>>,std::function<bool()>>::
      operator=((variant<std::basic_string_view<char,std::char_traits<char>>,std::function<bool()>>
                 *)this,&bStack_28);
    }
    else {
      __rhs = std::get<1ul,std::__cxx11::string,std::function<bool()>>
                        ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                          *)in_RSI);
      std::variant<std::basic_string_view<char,std::char_traits<char>>,std::function<bool()>>::
      operator=((variant<std::basic_string_view<char,std::char_traits<char>>,std::function<bool()>>
                 *)this,__rhs);
    }
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&(((pointer)this)->second).value.
                       super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                       .
                       super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                       .
                       super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                       .
                       super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                       .
                       super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
               + 8));
    *(undefined1 *)&(((pointer)this)->second).consume_after._M_dataplus._M_p =
         *(undefined1 *)&(in_RSI->second).consume_after._M_dataplus._M_p;
  }
  return (pointer)this;
}

Assistant:

pointer operator->() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator->");
      return &operator*();
    }